

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

void DrawTextRecEx(Font font,char *text,Rectangle rec,float fontSize,float spacing,_Bool wordWrap,
                  Color tint,int selectStart,int selectLength,Color selectTint,Color selectBackTint)

{
  Vector2 position;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Color tint_00;
  long lVar3;
  int iVar4;
  uint codepoint;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  undefined4 in_register_0000000c;
  CharInfo *pCVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  undefined4 in_register_00000084;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  float fVar18;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar19;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  Rectangle rec_00;
  int codepointByteCount;
  int local_104;
  int local_100;
  int local_dc;
  int local_d8;
  float local_d4;
  ulong local_d0;
  Color local_c4;
  Color local_c0;
  int local_bc;
  float local_b8;
  float local_b4;
  CharInfo *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  Rectangle *local_80;
  undefined8 local_78;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_78 = CONCAT44(in_register_00000084,selectLength);
  local_d0 = CONCAT44(in_register_0000000c,selectStart);
  auVar2._8_4_ = in_XMM1_Dc;
  auVar2._0_8_ = rec._8_8_;
  auVar2._12_4_ = in_XMM1_Dd;
  auVar1._8_4_ = in_XMM0_Dc;
  auVar1._0_8_ = rec._0_8_;
  auVar1._12_4_ = in_XMM0_Dd;
  lVar10 = 0;
  if ((text != (char *)0x0) && (*text != '\0')) {
    lVar10 = 0;
    do {
      lVar3 = lVar10 + 1;
      lVar10 = lVar10 + 1;
    } while (text[lVar3] != '\0');
  }
  iVar14 = (int)lVar10;
  if (0 < iVar14) {
    local_b8 = fontSize / (float)font.baseSize;
    bVar7 = !wordWrap;
    iVar4 = (int)((float)(font.baseSize / 2 + font.baseSize) * local_b8);
    local_b0 = font.chars;
    fVar19 = (float)font.baseSize * local_b8;
    local_58 = ZEXT416((uint)fVar19);
    local_70 = (ulong)(uint)(int)fVar19;
    local_80 = font.recs;
    local_98._4_4_ = rec.height;
    local_48 = (float)local_98._4_4_;
    fStack_44 = (float)local_98._4_4_;
    fStack_40 = (float)local_98._4_4_;
    fStack_3c = (float)local_98._4_4_;
    local_a8._4_4_ = rec.y;
    local_68 = (float)local_a8._4_4_;
    fStack_64 = (float)local_a8._4_4_;
    fStack_60 = (float)local_a8._4_4_;
    fStack_5c = (float)local_a8._4_4_;
    local_100 = -1;
    fVar19 = 0.0;
    iVar5 = 0;
    iVar13 = 0;
    iVar16 = 0;
    local_104 = -1;
    local_dc = -1;
    local_d4 = fontSize;
    local_c4 = tint;
    local_c0 = selectTint;
    local_b4 = spacing;
    local_a8 = auVar1;
    local_98._0_16_ = auVar2;
    do {
      local_d8 = 0;
      codepoint = GetNextCodepoint(text + iVar16,&local_d8);
      if (font.charsCount < 1) {
        lVar10 = 0x3f;
      }
      else {
        uVar6 = 0;
        pCVar9 = local_b0;
        do {
          if (pCVar9->value == codepoint) goto LAB_0013289b;
          uVar6 = uVar6 + 1;
          pCVar9 = pCVar9 + 1;
        } while ((uint)font.charsCount != uVar6);
        uVar6 = 0x3f;
LAB_0013289b:
        lVar10 = (long)(int)uVar6;
      }
      if (codepoint == 0x3f) {
        local_d8 = 1;
      }
      iVar12 = 0;
      if (codepoint != 10) {
        if (local_b0[lVar10].advanceX == 0) {
          fVar18 = local_80[lVar10].width;
        }
        else {
          fVar18 = (float)local_b0[lVar10].advanceX;
        }
        iVar12 = (int)(fVar18 * local_b8 + local_b4);
      }
      iVar15 = iVar16 + local_d8 + -1;
      if (bVar7) {
        if (codepoint == 10) {
          if (!wordWrap) {
            iVar5 = iVar5 + iVar4;
            fVar19 = 0.0;
          }
LAB_00132b6b:
          bVar7 = true;
          if ((wordWrap) && (iVar15 == local_104)) {
            iVar5 = iVar5 + iVar4;
            local_d0 = (ulong)(uint)((local_100 - iVar13) + (int)local_d0);
            fVar19 = 0.0;
            bVar7 = false;
            local_dc = local_104;
            local_104 = -1;
            iVar12 = 0;
            iVar13 = local_100;
          }
          goto LAB_00132bbb;
        }
        if ((!wordWrap) && ((float)local_98._0_4_ <= (float)iVar12 + fVar19 + 1.0)) {
          iVar5 = iVar5 + iVar4;
          fVar19 = 0.0;
        }
        if ((float)((int)local_70 + iVar5) <= local_48) {
          iVar16 = (int)local_d0;
          bVar7 = iVar13 < (int)local_78 + iVar16;
          if (bVar7 && (iVar16 <= iVar13 && -1 < iVar16)) {
            rec_00.x = (float)local_a8._0_4_ + fVar19 + -1.0;
            rec_00.width = (float)iVar12;
            rec_00.y = (float)iVar5 + local_68;
            rec_00.height = (float)local_58._0_4_;
            local_bc = iVar12;
            DrawRectangleRec(rec_00,selectBackTint);
            iVar12 = local_bc;
          }
          if ((codepoint != 9) && (codepoint != 0x20)) {
            tint_00 = local_c4;
            if (bVar7 && (iVar16 <= iVar13 && -1 < iVar16)) {
              tint_00 = local_c0;
            }
            position.y = (float)iVar5 + local_68;
            position.x = (float)local_a8._0_4_ + fVar19;
            DrawTextCodepoint(font,codepoint,position,local_d4,tint_00);
          }
          goto LAB_00132b6b;
        }
        bVar7 = true;
        bVar17 = false;
      }
      else {
        if ((codepoint < 0x21) && ((0x100000600U >> ((ulong)codepoint & 0x3f) & 1) != 0)) {
          local_104 = iVar15;
        }
        if ((float)local_98._0_4_ <= (float)iVar12 + fVar19 + 1.0) {
          iVar11 = local_104;
          if (local_104 < 1) {
            iVar11 = iVar15;
          }
          iVar8 = 0;
          if (iVar15 == iVar11) {
            iVar8 = local_d8;
          }
          local_104 = iVar11 - iVar8;
          if (local_d8 + local_dc == iVar11 - iVar8) {
            local_104 = iVar16 + -1;
          }
          bVar17 = true;
        }
        else {
          bVar17 = local_d8 + iVar16 == iVar14;
          if (bVar17) {
            local_104 = iVar15;
          }
          bVar17 = bVar17 || codepoint == 10;
        }
        bVar7 = false;
        if (bVar17) {
          iVar16 = iVar13 + -1;
          iVar12 = 0;
          fVar19 = 0.0;
          bVar7 = true;
          iVar15 = local_dc;
          iVar13 = local_100;
          local_100 = iVar16;
        }
LAB_00132bbb:
        fVar19 = fVar19 + (float)iVar12;
        bVar17 = true;
      }
      if (!bVar17) {
        return;
      }
      iVar16 = iVar15 + 1;
      iVar13 = iVar13 + 1;
    } while (iVar16 < iVar14);
  }
  return;
}

Assistant:

void DrawTextRecEx(Font font, const char *text, Rectangle rec, float fontSize, float spacing, bool wordWrap, Color tint, int selectStart, int selectLength, Color selectTint, Color selectBackTint)
{
    int length = TextLength(text);  // Total length in bytes of the text, scanned by codepoints in loop

    int textOffsetY = 0;            // Offset between lines (on line break '\n')
    float textOffsetX = 0.0f;       // Offset X to next character to draw

    float scaleFactor = fontSize/font.baseSize;     // Character quad scaling factor

    // Word/character wrapping mechanism variables
    enum { MEASURE_STATE = 0, DRAW_STATE = 1 };
    int state = wordWrap? MEASURE_STATE : DRAW_STATE;

    int startLine = -1;         // Index where to begin drawing (where a line begins)
    int endLine = -1;           // Index where to stop drawing (where a line ends)
    int lastk = -1;             // Holds last value of the character position

    for (int i = 0, k = 0; i < length; i++, k++)
    {
        // Get next codepoint from byte string and glyph index in font
        int codepointByteCount = 0;
        int codepoint = GetNextCodepoint(&text[i], &codepointByteCount);
        int index = GetGlyphIndex(font, codepoint);

        // NOTE: Normally we exit the decoding sequence as soon as a bad byte is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol moving one byte
        if (codepoint == 0x3f) codepointByteCount = 1;
        i += (codepointByteCount - 1);

        int glyphWidth = 0;
        if (codepoint != '\n')
        {
            glyphWidth = (font.chars[index].advanceX == 0)?
                         (int)(font.recs[index].width*scaleFactor + spacing):
                         (int)(font.chars[index].advanceX*scaleFactor + spacing);
        }

        // NOTE: When wordWrap is ON we first measure how much of the text we can draw before going outside of the rec container
        // We store this info in startLine and endLine, then we change states, draw the text between those two variables
        // and change states again and again recursively until the end of the text (or until we get outside of the container).
        // When wordWrap is OFF we don't need the measure state so we go to the drawing state immediately
        // and begin drawing on the next line before we can get outside the container.
        if (state == MEASURE_STATE)
        {
            // TODO: There are multiple types of spaces in UNICODE, maybe it's a good idea to add support for more
            // Ref: http://jkorpela.fi/chars/spaces.html
            if ((codepoint == ' ') || (codepoint == '\t') || (codepoint == '\n')) endLine = i;

            if ((textOffsetX + glyphWidth + 1) >= rec.width)
            {
                endLine = (endLine < 1)? i : endLine;
                if (i == endLine) endLine -= codepointByteCount;
                if ((startLine + codepointByteCount) == endLine) endLine = (i - codepointByteCount);

                state = !state;
            }
            else if ((i + 1) == length)
            {
                endLine = i;

                state = !state;
            }
            else if (codepoint == '\n') state = !state;

            if (state == DRAW_STATE)
            {
                textOffsetX = 0;
                i = startLine;
                glyphWidth = 0;

                // Save character position when we switch states
                int tmp = lastk;
                lastk = k - 1;
                k = tmp;
            }
        }
        else
        {
            if (codepoint == '\n')
            {
                if (!wordWrap)
                {
                    textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                    textOffsetX = 0;
                }
            }
            else
            {
                if (!wordWrap && ((textOffsetX + glyphWidth + 1) >= rec.width))
                {
                    textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                    textOffsetX = 0;
                }

                // When text overflows rectangle height limit, just stop drawing
                if ((textOffsetY + (int)(font.baseSize*scaleFactor)) > rec.height) break;

                // Draw selection background
                bool isGlyphSelected = false;
                if ((selectStart >= 0) && (k >= selectStart) && (k < (selectStart + selectLength)))
                {
                    DrawRectangleRec((Rectangle){ rec.x + textOffsetX - 1, rec.y + textOffsetY, (float)glyphWidth, (float)font.baseSize*scaleFactor }, selectBackTint);
                    isGlyphSelected = true;
                }

                // Draw current character glyph
                if ((codepoint != ' ') && (codepoint != '\t'))
                {
                    DrawTextCodepoint(font, codepoint, (Vector2){ rec.x + textOffsetX, rec.y + textOffsetY }, fontSize, isGlyphSelected? selectTint : tint);
                }
            }

            if (wordWrap && (i == endLine))
            {
                textOffsetY += (int)((font.baseSize + font.baseSize/2)*scaleFactor);
                textOffsetX = 0;
                startLine = endLine;
                endLine = -1;
                glyphWidth = 0;
                selectStart += lastk - k;
                k = lastk;

                state = !state;
            }
        }

        textOffsetX += glyphWidth;
    }
}